

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

char * __thiscall wabt::Type::GetName(Type *this)

{
  Enum EVar1;
  
  EVar1 = this->enum_;
  switch(EVar1) {
  case Any:
    return "any";
  case Exnref:
    return "exnref";
  case 0xffffffe9:
  case Exnref|Hostref:
  case 0xffffffeb:
  case Exnref|I8U:
  case 0xffffffed:
  case 0xfffffff1:
  case Funcref|Hostref:
  case 0xfffffff3:
  case Funcref|I8U:
  case 0xfffffff5:
  case Funcref|I16U:
  case Funcref|I32U:
  case ~I32U:
    goto switchD_001879b4_caseD_ffffffe9;
  case Nullref:
    return "nullref";
  case Anyref:
    return "anyref";
  case Funcref:
    return "funcref";
  case I16:
    return "i16";
  case I8:
    return "i8";
  case V128:
    return "v128";
  case F64:
    return "f64";
  case F32:
    return "f32";
  case I64:
    return "i64";
  case I32:
    return "i32";
  default:
    if (EVar1 == Void) {
      return "void";
    }
    if (EVar1 == Func) {
      return "func";
    }
switchD_001879b4_caseD_ffffffe9:
    return "<type_index>";
  }
}

Assistant:

const char* GetName() const {
    switch (enum_) {
      case Type::I32:     return "i32";
      case Type::I64:     return "i64";
      case Type::F32:     return "f32";
      case Type::F64:     return "f64";
      case Type::V128:    return "v128";
      case Type::I8:      return "i8";
      case Type::I16:     return "i16";
      case Type::Funcref: return "funcref";
      case Type::Func:    return "func";
      case Type::Exnref:  return "exnref";
      case Type::Void:    return "void";
      case Type::Any:     return "any";
      case Type::Anyref:  return "anyref";
      case Type::Nullref: return "nullref";
      default:            return "<type_index>";
    }
  }